

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# headers.c
# Opt level: O2

CURLcode Curl_headers_cleanup(Curl_easy *data)

{
  void **ppvVar1;
  Curl_llist_element *pCVar2;
  
  pCVar2 = (data->state).httphdrs.head;
  while (pCVar2 != (Curl_llist_element *)0x0) {
    ppvVar1 = &pCVar2->ptr;
    pCVar2 = pCVar2->next;
    (*Curl_cfree)(*ppvVar1);
  }
  Curl_llist_init(&(data->state).httphdrs,(Curl_llist_dtor)0x0);
  return CURLE_OK;
}

Assistant:

CURLcode Curl_headers_cleanup(struct Curl_easy *data)
{
  struct Curl_llist_element *e;
  struct Curl_llist_element *n;

  for(e = data->state.httphdrs.head; e; e = n) {
    struct Curl_header_store *hs = e->ptr;
    n = e->next;
    free(hs);
  }
  headers_init(data);
  return CURLE_OK;
}